

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O0

void __thiscall
libcellml::GeneratorProfile::setImplementationInitialiseVariablesMethodString
          (GeneratorProfile *this,bool forDifferentialModel,bool withExternalVariables,
          string *implementationInitialiseVariablesMethodString)

{
  string *implementationInitialiseVariablesMethodString_local;
  bool withExternalVariables_local;
  bool forDifferentialModel_local;
  GeneratorProfile *this_local;
  
  if (forDifferentialModel) {
    if (withExternalVariables) {
      std::__cxx11::string::operator=
                ((string *)&this->mPimpl->mImplementationInitialiseVariablesMethodFdmWevString,
                 (string *)implementationInitialiseVariablesMethodString);
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&this->mPimpl->mImplementationInitialiseVariablesMethodFdmWoevString,
                 (string *)implementationInitialiseVariablesMethodString);
    }
  }
  else if (withExternalVariables) {
    std::__cxx11::string::operator=
              ((string *)&this->mPimpl->mImplementationInitialiseVariablesMethodFamWevString,
               (string *)implementationInitialiseVariablesMethodString);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&this->mPimpl->mImplementationInitialiseVariablesMethodFamWoevString,
               (string *)implementationInitialiseVariablesMethodString);
  }
  return;
}

Assistant:

void GeneratorProfile::setImplementationInitialiseVariablesMethodString(bool forDifferentialModel,
                                                                        bool withExternalVariables,
                                                                        const std::string &implementationInitialiseVariablesMethodString)
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            mPimpl->mImplementationInitialiseVariablesMethodFdmWevString = implementationInitialiseVariablesMethodString;
        } else {
            mPimpl->mImplementationInitialiseVariablesMethodFdmWoevString = implementationInitialiseVariablesMethodString;
        }
    } else {
        if (withExternalVariables) {
            mPimpl->mImplementationInitialiseVariablesMethodFamWevString = implementationInitialiseVariablesMethodString;
        } else {
            mPimpl->mImplementationInitialiseVariablesMethodFamWoevString = implementationInitialiseVariablesMethodString;
        }
    }
}